

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

lua_Integer luaV_shiftl(lua_Integer x,lua_Integer y)

{
  long lVar1;
  
  if (-1 < y) {
    lVar1 = x << ((byte)y & 0x3f);
    if (0x3f < (ulong)y) {
      lVar1 = 0;
    }
    return lVar1;
  }
  if ((ulong)y < 0xffffffffffffffc1) {
    return 0;
  }
  return (ulong)x >> (-(byte)y & 0x3f);
}

Assistant:

lua_Integer luaV_shiftl (lua_Integer x, lua_Integer y) {
  if (y < 0) {  /* shift right? */
    if (y <= -NBITS) return 0;
    else return intop(>>, x, -y);
  }
  else {  /* shift left */
    if (y >= NBITS) return 0;
    else return intop(<<, x, y);
  }
}